

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

String * __thiscall
kj::InputStream::readAllText(String *__return_storage_ptr__,InputStream *this,uint64_t limit)

{
  Array<unsigned_char> local_50;
  Array<char> local_38;
  uint64_t local_20;
  uint64_t limit_local;
  InputStream *this_local;
  
  local_20 = limit;
  limit_local = (uint64_t)this;
  this_local = (InputStream *)__return_storage_ptr__;
  anon_unknown_73::readAll(&local_50,this,limit,true);
  Array<unsigned_char>::releaseAsChars(&local_38,&local_50);
  String::String(__return_storage_ptr__,&local_38);
  Array<char>::~Array(&local_38);
  Array<unsigned_char>::~Array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String InputStream::readAllText(uint64_t limit) {
  return String(readAll(*this, limit, true).releaseAsChars());
}